

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c
# Opt level: O1

void duckdb_je_malloc_mutex_prefork(tsdn_t *tsdn,malloc_mutex_t *mutex)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  int iVar3;
  mutex_prof_data_t *data;
  
  iVar3 = pthread_mutex_trylock((pthread_mutex_t *)((long)&mutex->field_0 + 0x48));
  if (iVar3 != 0) {
    duckdb_je_malloc_mutex_lock_slow(mutex);
    (mutex->field_0).field_0.locked.repr = true;
  }
  puVar1 = &(mutex->field_0).field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((mutex->field_0).field_0.prof_data.prev_owner != tsdn) {
    (mutex->field_0).field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(mutex->field_0).witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  return;
}

Assistant:

void
malloc_mutex_prefork(tsdn_t *tsdn, malloc_mutex_t *mutex) {
	malloc_mutex_lock(tsdn, mutex);
}